

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::StringPtr> * __thiscall
kj::ArrayBuilder<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator=
          (ArrayBuilder<kj::TreeMap<int,_kj::StringPtr>::Entry> *this,
          ArrayBuilder<kj::StringPtr> *other)

{
  RemoveConst<kj::StringPtr> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  *(StringPtr **)this = other->ptr;
  *(RemoveConst<kj::StringPtr> **)(this + 8) = pRVar1;
  pAVar2 = other->disposer;
  *(StringPtr **)(this + 0x10) = other->endPtr;
  *(ArrayDisposer **)(this + 0x18) = pAVar2;
  other->ptr = (StringPtr *)0x0;
  other->pos = (RemoveConst<kj::StringPtr> *)0x0;
  other->endPtr = (StringPtr *)0x0;
  return (ArrayBuilder<kj::StringPtr> *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }